

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::encode_url(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  char *pcVar2;
  undefined1 *puVar3;
  byte *pbVar4;
  size_t len;
  byte local_2d;
  char hex [4];
  uint8_t c;
  int i;
  string *s_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  do {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar2 == '\0') {
      return __return_storage_ptr__;
    }
    puVar3 = (undefined1 *)std::__cxx11::string::operator[]((ulong)s);
    switch(*puVar3) {
    case 0x20:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%20");
      break;
    default:
      pbVar4 = (byte *)std::__cxx11::string::operator[]((ulong)s);
      local_2d = *pbVar4;
      if (local_2d < 0x80) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'%');
        iVar1 = snprintf((char *)((long)&len + 7),3,"%02X",(ulong)local_2d);
        if (iVar1 != 2) {
          __assert_fail("len == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                        ,0x3bb,"std::string httplib::detail::encode_url(const std::string &)");
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__,(long)&len + 7);
      }
      break;
    case 0x27:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%27");
      break;
    case 0x2b:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%2B");
      break;
    case 0x2c:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%2C");
      break;
    case 0x3a:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%3A");
      break;
    case 0x3b:
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"%3B");
    }
  } while( true );
}

Assistant:

inline std::string encode_url(const std::string& s)
{
    std::string result;

    for (auto i = 0; s[i]; i++) {
        switch (s[i]) {
        case ' ':  result += "%20"; break;
        case '+':  result += "%2B"; break;
        case '\'': result += "%27"; break;
        case ',':  result += "%2C"; break;
        case ':':  result += "%3A"; break;
        case ';':  result += "%3B"; break;
        default:
            auto c = static_cast<uint8_t>(s[i]);
            if (c >= 0x80) {
                result += '%';
                char hex[4];
                size_t len = snprintf(hex, sizeof(hex) - 1, "%02X", c);
                assert(len == 2);
                result.append(hex, len);
            } else {
                result += s[i];
            }
            break;
        }
   }

    return result;
}